

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

ARTConflictType __thiscall
duckdb::ART::Insert(ART *this,Node *node,ARTKey *key,idx_t depth,ARTKey *row_id,GateStatus status,
                   optional_ptr<duckdb::ART,_true> delete_art,IndexAppendMode append_mode)

{
  ulong uVar1;
  byte bVar2;
  ARTConflictType AVar3;
  int iVar4;
  InternalException *this_00;
  string local_50;
  
  do {
    while( true ) {
      uVar1 = (node->super_IndexPointer).data;
      if (uVar1 >> 0x38 == 0) {
        InsertIntoEmpty(this,node,key,depth,row_id,status);
        return NO_CONFLICT;
      }
      if ((long)uVar1 < 0 && status == GATE_NOT_SET) break;
      bVar2 = (byte)(uVar1 >> 0x38);
      if ((bVar2 & 0x7f) != 2) {
        switch(bVar2 & 0x7f) {
        case 1:
          AVar3 = Prefix::Insert(this,node,key,depth,row_id,status,delete_art,append_mode);
          return AVar3;
        default:
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Invalid node type for ART::Insert.","");
          InternalException::InternalException(this_00,&local_50);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        case 3:
        case 4:
        case 5:
        case 6:
          AVar3 = InsertIntoNode(this,node,key,depth,row_id,status,delete_art,append_mode);
          return AVar3;
        case 7:
          AVar3 = InsertIntoInlined(this,node,key,depth,row_id,status,delete_art,append_mode);
          return AVar3;
        case 8:
        case 9:
        case 10:
          Node::InsertChild(this,node,key->data[7],(Node)0x0);
          return NO_CONFLICT;
        }
      }
      Leaf::TransformToNested(this,node);
    }
    iVar4 = (*(this->super_BoundIndex).super_Index._vptr_Index[5])(this);
    status = GATE_SET;
    depth = 0;
    key = row_id;
  } while (1 < (byte)((char)iVar4 - 1U));
  return TRANSACTION;
}

Assistant:

ARTConflictType ART::Insert(Node &node, const ARTKey &key, idx_t depth, const ARTKey &row_id, const GateStatus status,
                            optional_ptr<ART> delete_art, const IndexAppendMode append_mode) {
	if (!node.HasMetadata()) {
		InsertIntoEmpty(node, key, depth, row_id, status);
		return ARTConflictType::NO_CONFLICT;
	}

	// Enter a nested leaf.
	if (status == GateStatus::GATE_NOT_SET && node.GetGateStatus() == GateStatus::GATE_SET) {
		if (IsUnique()) {
			// Unique indexes can have duplicates, if another transaction DELETE + INSERT
			// the same key. In that case, the previous value must be kept alive until all
			// other transactions do not depend on it anymore.

			// We restrict this transactionality to two-value leaves, so any subsequent
			// incoming transaction must fail here.
			return ARTConflictType::TRANSACTION;
		}
		return Insert(node, row_id, 0, row_id, GateStatus::GATE_SET, delete_art, append_mode);
	}

	auto type = node.GetType();
	switch (type) {
	case NType::LEAF_INLINED: {
		return InsertIntoInlined(node, key, depth, row_id, status, delete_art, append_mode);
	}
	case NType::LEAF: {
		Leaf::TransformToNested(*this, node);
		return Insert(node, key, depth, row_id, status, delete_art, append_mode);
	}
	case NType::NODE_7_LEAF:
	case NType::NODE_15_LEAF:
	case NType::NODE_256_LEAF: {
		// Row IDs are unique, so there are never any duplicate byte conflicts here.
		auto byte = key[Prefix::ROW_ID_COUNT];
		Node::InsertChild(*this, node, byte);
		return ARTConflictType::NO_CONFLICT;
	}
	case NType::NODE_4:
	case NType::NODE_16:
	case NType::NODE_48:
	case NType::NODE_256:
		return InsertIntoNode(node, key, depth, row_id, status, delete_art, append_mode);
	case NType::PREFIX:
		return Prefix::Insert(*this, node, key, depth, row_id, status, delete_art, append_mode);
	default:
		throw InternalException("Invalid node type for ART::Insert.");
	}
}